

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_compressCTable_internal
                 (BYTE *ostart,BYTE *op,BYTE *oend,void *src,size_t srcSize,
                 HUF_nbStreams_e nbStreams,HUF_CElt *CTable,int flags)

{
  uint uVar1;
  ulong uVar2;
  void *in_RCX;
  long in_RSI;
  ulong in_RDI;
  size_t in_R8;
  int in_R9D;
  int unaff_retaddr;
  size_t cSize;
  undefined4 in_stack_00000010;
  HUF_CElt *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  size_t local_8;
  
  if (in_R9D == 0) {
    local_8 = HUF_compress1X_usingCTable_internal
                        (in_RCX,in_R8,(void *)(ulong)in_stack_ffffffffffffffc8,
                         in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
  }
  else {
    local_8 = HUF_compress4X_usingCTable_internal
                        (oend,(size_t)src,(void *)srcSize,CONCAT44(nbStreams,in_stack_00000010),
                         (HUF_CElt *)cSize,unaff_retaddr);
  }
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    if (local_8 == 0) {
      local_8 = 0;
    }
    else {
      uVar2 = local_8 + in_RSI;
      if (uVar2 < in_RDI) {
        __assert_fail("op >= ostart",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3f8f,
                      "size_t HUF_compressCTable_internal(BYTE *const, BYTE *, BYTE *const, const void *, size_t, HUF_nbStreams_e, const HUF_CElt *, const int)"
                     );
      }
      if (uVar2 - in_RDI < in_R8 - 1) {
        local_8 = uVar2 - in_RDI;
      }
      else {
        local_8 = 0;
      }
    }
  }
  return local_8;
}

Assistant:

static size_t HUF_compressCTable_internal(
                BYTE* const ostart, BYTE* op, BYTE* const oend,
                const void* src, size_t srcSize,
                HUF_nbStreams_e nbStreams, const HUF_CElt* CTable, const int flags)
{
    size_t const cSize = (nbStreams==HUF_singleStream) ?
                         HUF_compress1X_usingCTable_internal(op, (size_t)(oend - op), src, srcSize, CTable, flags) :
                         HUF_compress4X_usingCTable_internal(op, (size_t)(oend - op), src, srcSize, CTable, flags);
    if (HUF_isError(cSize)) { return cSize; }
    if (cSize==0) { return 0; }   /* uncompressible */
    op += cSize;
    /* check compressibility */
    assert(op >= ostart);
    if ((size_t)(op-ostart) >= srcSize-1) { return 0; }
    return (size_t)(op-ostart);
}